

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCullDistanceTests.cpp
# Opt level: O3

int __thiscall glcts::CullDistance::Tests::init(Tests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int extraout_EAX;
  TestNode *pTVar2;
  
  pTVar2 = (TestNode *)operator_new(0xb0);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"coverage","Cull Distance API Coverage Test");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_020c97c0;
  pTVar2[1].m_testCtx = (TestContext *)0x0;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar2[1].m_name._M_string_length = 0;
  pTVar2[1].m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pTVar2[1].m_name.field_2 + 8) = 0;
  pTVar2[1].m_description._M_dataplus._M_p = (pointer)0x0;
  *(undefined4 *)&pTVar2[1].m_description._M_string_length = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0xd0);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"functional","Cull Distance Functional Test");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__FunctionalTest_020c9940;
  pTVar2[1].m_testCtx = (TestContext *)0x0;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar2[1].m_name._M_string_length = 0;
  pTVar2[1].m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pTVar2[1].m_name.field_2 + 8) = 0;
  pTVar2[1].m_description._M_dataplus._M_p = (pointer)0x0;
  pTVar2[1].m_description._M_string_length = 0;
  pTVar2[1].m_description.field_2._M_allocated_capacity = 0x20000000200;
  *(undefined8 *)((long)&pTVar2[1].m_description.field_2 + 8) = 0;
  *(undefined8 *)&pTVar2[1].m_nodeType = 0;
  pTVar2[1].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"negative","Cull Distance Negative Test");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_020c9978;
  pTVar2[1].m_testCtx = (TestContext *)0x0;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined4 *)&pTVar2[1].m_name._M_string_length = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  return extraout_EAX;
}

Assistant:

void CullDistance::Tests::init()
{
	addChild(new CullDistance::APICoverageTest(m_context));
	addChild(new CullDistance::FunctionalTest(m_context));
	addChild(new CullDistance::NegativeTest(m_context));
}